

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch.cpp
# Opt level: O2

interval_t
duckdb::NormalizedIntervalOperator::Operation<duckdb::interval_t,duckdb::interval_t>
          (interval_t input)

{
  interval_t iVar1;
  interval_t local_10;
  
  iVar1 = interval_t::Normalize(&local_10);
  return iVar1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		return input.Normalize();
	}